

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O2

void __thiscall
tt::net::EventLoop::updatePoller(EventLoop *this,shared_ptr<tt::net::Channel> *channel,int timeout)

{
  Epoll *this_00;
  __shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (this->m_epoll).super___shared_ptr<tt::net::Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&channel->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
  Epoll::epoll_mod(this_00,(SP_Channel *)&local_30,timeout);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void EventLoop::updatePoller(std::shared_ptr<Channel> channel, int timeout){ 
		m_epoll->epoll_mod(channel, timeout); 
}